

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::ReferenceResolver::ReferenceResolver(ReferenceResolver *this,Tree *t_)

{
  this->t = t_;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::stack(&this->refs,&t_->m_callbacks);
  resolve(this);
  return;
}

Assistant:

ReferenceResolver(Tree *t_) : t(t_), refs(t_->callbacks())
    {
        resolve();
    }